

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool fast_float::small_add_from<(unsigned_short)62>
               (stackvec<(unsigned_short)62> *vec,limb y,size_t start)

{
  size_t sVar1;
  limb *plVar2;
  limb lVar3;
  bool bVar4;
  byte local_59;
  limb lStack_58;
  bool overflow;
  limb carry;
  size_t index;
  size_t start_local;
  limb y_local;
  stackvec<(unsigned_short)62> *vec_local;
  limb local_28;
  limb z;
  ulong local_18;
  ulong local_10;
  
  lStack_58 = y;
  carry = start;
  index = start;
  start_local = y;
  y_local = (limb)vec;
  while( true ) {
    lVar3 = carry;
    bVar4 = false;
    if (lStack_58 != 0) {
      sVar1 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)y_local);
      bVar4 = lVar3 < sVar1;
    }
    if (!bVar4) break;
    plVar2 = stackvec<(unsigned_short)62>::operator[]((stackvec<(unsigned_short)62> *)y_local,carry)
    ;
    local_10 = *plVar2;
    local_18 = lStack_58;
    z = (limb)&local_59;
    local_59 = CARRY8(local_10,lStack_58);
    lVar3 = local_10 + lStack_58;
    local_28 = lVar3;
    plVar2 = stackvec<(unsigned_short)62>::operator[]((stackvec<(unsigned_short)62> *)y_local,carry)
    ;
    *plVar2 = lVar3;
    lStack_58 = (limb)(local_59 & 1);
    carry = carry + 1;
  }
  if ((lStack_58 == 0) ||
     (bVar4 = stackvec<(unsigned_short)62>::try_push
                        ((stackvec<(unsigned_short)62> *)y_local,lStack_58), bVar4)) {
    vec_local._7_1_ = true;
  }
  else {
    vec_local._7_1_ = false;
  }
  return vec_local._7_1_;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
bool small_add_from(stackvec<size>& vec, limb y, size_t start) noexcept {
  size_t index = start;
  limb carry = y;
  bool overflow;
  while (carry != 0 && index < vec.len()) {
    vec[index] = scalar_add(vec[index], carry, overflow);
    carry = limb(overflow);
    index += 1;
  }
  if (carry != 0) {
    FASTFLOAT_TRY(vec.try_push(carry));
  }
  return true;
}